

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall
r_comp::Decompiler::write_any
          (Decompiler *this,uint16_t read_index,bool *after_tail_wildcard,bool apply_time_offset,
          uint16_t write_as_view_index)

{
  size_type *__lhs;
  uint uVar1;
  ostringstream *poVar2;
  ImageObject *pIVar3;
  Metadata *pMVar4;
  char cVar5;
  undefined1 uVar6;
  byte bVar7;
  bool bVar8;
  short sVar9;
  ushort uVar10;
  uint16_t uVar11;
  Atom *pAVar12;
  uint *puVar13;
  offset_in_Decompiler_to_subr *poVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  OutStream *pOVar15;
  long lVar16;
  SysObject **ppSVar17;
  Class *pCVar18;
  iterator iVar19;
  code *pcVar20;
  uint64_t uVar21;
  long *plVar22;
  undefined6 in_register_00000032;
  char *pcVar23;
  uint uVar24;
  ulong i;
  Atom atom;
  Atom a;
  allocator local_109;
  string s;
  key_type local_c0;
  undefined4 local_9c;
  string member_name;
  Atom first;
  undefined3 uStack_77;
  
  pAVar12 = r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(this->current_object + 8),
                       CONCAT62(in_register_00000032,read_index) & 0xffffffff);
  _a = *(int *)pAVar12;
  cVar5 = r_code::Atom::isFloat();
  if (cVar5 != '\0') {
    if (_a == 0x3fffffff) {
      OutStream::push<char[4]>(this->out_stream,(char (*) [4])"|nb",read_index);
    }
    else {
      r_code::Atom::PlusInfinity();
      cVar5 = r_code::Atom::operator==(&a,(Atom *)&s);
      r_code::Atom::~Atom((Atom *)&s);
      pOVar15 = this->out_stream;
      if (cVar5 == '\0') {
        poVar2 = pOVar15->stream;
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        s._M_dataplus._M_p._0_4_ = r_code::Atom::asFloat();
        OutStream::push<float>(pOVar15,(float *)&s,read_index);
      }
      else {
        OutStream::push<char[8]>(pOVar15,(char (*) [8])"forever",read_index);
      }
    }
    goto LAB_0013c3af;
  }
  r_code::Atom::Atom(&atom,0xffffffff);
  uVar6 = r_code::Atom::getDescriptor();
  switch(uVar6) {
  case 0x80:
    pcVar23 = "nil";
    goto LAB_0013c1b2;
  case 0x81:
    cVar5 = r_code::Atom::readsAsNil();
    if (cVar5 != '\0') {
      pcVar23 = "|bl";
      goto LAB_0013c1b2;
    }
    pOVar15 = this->out_stream;
    poVar2 = pOVar15->stream;
    poVar2 = poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18;
    *(uint *)poVar2 = *(uint *)poVar2 | 1;
    uVar6 = r_code::Atom::asBoolean();
    s._M_dataplus._M_p._0_1_ = uVar6;
    OutStream::push<bool>(pOVar15,(bool *)&s,read_index);
    break;
  case 0x82:
    if (*after_tail_wildcard == true) {
      OutStream::push(this->out_stream);
    }
    else {
      s._M_dataplus._M_p._0_1_ = 0x3a;
      OutStream::push<char>(this->out_stream,(char *)&s,read_index);
    }
    break;
  case 0x83:
    OutStream::push<char[3]>(this->out_stream,(char (*) [3])"::",read_index);
    *after_tail_wildcard = true;
    break;
  case 0x84:
    goto switchD_0013c025_caseD_84;
  case 0x85:
    pOVar15 = this->out_stream;
    pIVar3 = this->current_object;
    uVar10 = r_code::Atom::asIndex();
    puVar13 = r_code::vector<unsigned_int>::operator[]
                        ((vector<unsigned_int> *)(pIVar3 + 0x20),(ulong)uVar10);
    get_object_name_abi_cxx11_(&s,this,(uint16_t)*puVar13);
    OutStream::push<std::__cxx11::string>(pOVar15,&s,read_index);
    goto LAB_0013c2de;
  case 0x86:
    bVar7 = this->in_hlp;
    if ((bool)bVar7 != true) goto LAB_0013c1fa;
    sVar9 = r_code::Atom::asCastOpcode();
    if (sVar9 != 0xffe) {
      uVar11 = r_code::Atom::asIndex();
      get_hlp_variable_name_abi_cxx11_(&s,this,uVar11);
      OutStream::push<std::__cxx11::string>(this->out_stream,&s,read_index);
      goto LAB_0013c2de;
    }
    s._M_dataplus._M_p._0_1_ = 0x3a;
    OutStream::push<char>(this->out_stream,(char *)&s,read_index);
    break;
  default:
    goto switchD_0013c025_caseD_87;
  case 0x8d:
    bVar7 = this->in_hlp;
LAB_0013c1fa:
    if ((bVar7 & 1) != 0) {
      pOVar15 = this->out_stream;
      bVar7 = r_code::Atom::asAssignmentIndex();
      get_hlp_variable_name_abi_cxx11_(&s,this,(ushort)bVar7);
      OutStream::push<std::__cxx11::string>(pOVar15,&s,read_index);
      std::__cxx11::string::~string((string *)&s);
      OutStream::operator<<(this->out_stream,(char (*) [2])0x14672e);
    }
switchD_0013c025_caseD_84:
    uVar10 = r_code::Atom::asIndex();
    pAVar12 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)uVar10);
    r_code::Atom::operator=(&atom,pAVar12);
    while (cVar5 = r_code::Atom::getDescriptor(), cVar5 == -0x7c) {
      uVar10 = r_code::Atom::asIndex();
      pAVar12 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)uVar10);
      r_code::Atom::operator=(&atom,pAVar12);
    }
    i = (ulong)uVar10;
    uVar24 = (uint)uVar10;
    if (uVar10 < read_index) {
      cVar5 = r_code::Atom::getDescriptor();
      get_variable_name_abi_cxx11_(&s,this,uVar10,cVar5 != -0x7e);
      OutStream::push<std::__cxx11::string>(this->out_stream,&s,read_index);
LAB_0013c2de:
      std::__cxx11::string::~string((string *)&s);
    }
    else {
      uVar6 = r_code::Atom::getDescriptor();
      switch(uVar6) {
      case 0xc0:
        bVar7 = r_code::Atom::getAtomCount();
        pAVar12 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(uVar24 + 1))
        ;
        r_code::Atom::operator=(&atom,pAVar12);
        cVar5 = r_code::Atom::getDescriptor();
        if (cVar5 == -0x7b) {
          pIVar3 = this->current_object;
          uVar10 = r_code::Atom::asIndex();
          puVar13 = r_code::vector<unsigned_int>::operator[]
                              ((vector<unsigned_int> *)(pIVar3 + 0x20),(ulong)uVar10);
          uVar1 = *puVar13;
          pOVar15 = this->out_stream;
          get_object_name_abi_cxx11_(&s,this,(uint16_t)uVar1);
          OutStream::push<std::__cxx11::string>(pOVar15,&s,read_index);
          std::__cxx11::string::~string((string *)&s);
          ppSVar17 = r_code::vector<r_code::SysObject_*>::operator[]
                               (&(this->image->code_segment).objects,(ulong)uVar1);
          r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(*ppSVar17 + 8),0);
          uVar10 = r_code::Atom::asOpcode();
        }
        else if (cVar5 == -0x7a) {
          local_9c = r_code::Atom::asCastOpcode();
          while( true ) {
            pIVar3 = this->current_object;
            uVar10 = r_code::Atom::asIndex();
            r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar10);
            cVar5 = r_code::Atom::getDescriptor();
            if (cVar5 != -0x7c) break;
            pIVar3 = this->current_object;
            uVar10 = r_code::Atom::asIndex();
            pAVar12 = r_code::vector<r_code::Atom>::operator[]
                                ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar10);
            r_code::Atom::operator=(&atom,pAVar12);
          }
          pOVar15 = this->out_stream;
          uVar11 = r_code::Atom::asIndex();
          pIVar3 = this->current_object;
          uVar10 = r_code::Atom::asIndex();
          r_code::vector<r_code::Atom>::operator[]
                    ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar10);
          cVar5 = r_code::Atom::getDescriptor();
          get_variable_name_abi_cxx11_(&s,this,uVar11,cVar5 != -0x7e);
          OutStream::push<std::__cxx11::string>(pOVar15,&s,read_index);
          std::__cxx11::string::~string((string *)&s);
          uVar10 = (ushort)(byte)local_9c;
          if ((byte)local_9c == 0xff) {
            pIVar3 = this->current_object;
            uVar10 = r_code::Atom::asIndex();
            r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar10);
            r_code::Atom::getDescriptor();
            pIVar3 = this->current_object;
            uVar10 = r_code::Atom::asIndex();
            r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar10);
            uVar10 = r_code::Atom::asOpcode();
          }
        }
        else {
          if (cVar5 != -0x70) {
            OutStream::push<char[23]>
                      (this->out_stream,(char (*) [23])"unknown-cptr-lead-type",read_index);
            break;
          }
          OutStream::push<char[5]>(this->out_stream,(char (*) [5])"this",read_index);
          pMVar4 = this->metadata;
          std::__cxx11::string::string((string *)&s,"ipgm",(allocator *)&first);
          std::__detail::
          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&pMVar4->sys_classes,&s);
          uVar10 = r_code::Atom::asOpcode();
          std::__cxx11::string::~string((string *)&s);
        }
        pCVar18 = r_code::vector<r_comp::Class>::operator[]
                            (&this->metadata->classes_by_opcodes,(ulong)uVar10);
        Class::Class((Class *)&s,pCVar18);
        for (lVar16 = 2; (ushort)lVar16 <= (ushort)bVar7; lVar16 = lVar16 + 1) {
          member_name._M_dataplus._M_p = (pointer)&member_name.field_2;
          member_name._M_string_length = 0;
          member_name.field_2._M_local_buf[0] = '\0';
          pAVar12 = r_code::vector<r_code::Atom>::operator[]
                              ((vector<r_code::Atom> *)(this->current_object + 8),i + lVar16);
          r_code::Atom::operator=(&atom,pAVar12);
          cVar5 = r_code::Atom::getDescriptor();
          if ((byte)(cVar5 + 0x6fU) < 3) {
            std::__cxx11::string::assign((char *)&member_name);
          }
          else {
            uVar10 = r_code::Atom::asIndex();
            Class::get_member_name_abi_cxx11_((string *)&first,(Class *)&s,(ulong)uVar10);
            std::__cxx11::string::operator=((string *)&member_name,(string *)&first);
            std::__cxx11::string::~string((string *)&first);
            if ((uint)lVar16 < (uint)bVar7) {
              pCVar18 = Class::get_member_class((Class *)&s,this->metadata,&member_name);
              Class::operator=((Class *)&s,pCVar18);
            }
          }
          first = (Atom)0x2e;
          pOVar15 = OutStream::operator<<(this->out_stream,(char *)&first);
          OutStream::operator<<(pOVar15,&member_name);
          bVar8 = std::operator==(&member_name,"vw");
          if (bVar8) {
            pAVar12 = r_code::vector<r_code::Atom>::operator[]
                                ((vector<r_code::Atom> *)(this->current_object + 8),
                                 (ulong)(bVar7 + uVar24));
            r_code::Atom::operator=(&atom,pAVar12);
            Class::Class((Class *)&first,ANY);
            __lhs = &s._M_string_length;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"grp");
            if (bVar8) {
              pMVar4 = this->metadata;
              std::__cxx11::string::string((string *)&local_c0,"grp_view",&local_109);
              iVar19 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)pMVar4,&local_c0);
              Class::operator=((Class *)&first,
                               (Class *)((long)iVar19.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                               ._M_cur + 0x28));
            }
            else {
              bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"ipgm");
              if ((((bVar8) ||
                   (bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs,"icpp_pgm"), bVar8)) ||
                  (bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)__lhs,"mdl"), bVar8)) ||
                 (bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"cst"), bVar8)) {
                pMVar4 = this->metadata;
                std::__cxx11::string::string((string *)&local_c0,"pgm_view",&local_109);
                iVar19 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)pMVar4,&local_c0);
                Class::operator=((Class *)&first,
                                 (Class *)((long)iVar19.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                 ._M_cur + 0x28));
              }
              else {
                pMVar4 = this->metadata;
                std::__cxx11::string::string((string *)&local_c0,"view",&local_109);
                iVar19 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)pMVar4,&local_c0);
                Class::operator=((Class *)&first,
                                 (Class *)((long)iVar19.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                 ._M_cur + 0x28));
              }
            }
            std::__cxx11::string::~string((string *)&local_c0);
            uVar10 = r_code::Atom::asIndex();
            Class::get_member_name_abi_cxx11_(&local_c0,(Class *)&first,(ulong)uVar10);
            std::__cxx11::string::operator=((string *)&member_name,(string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            local_c0._M_dataplus._M_p._0_1_ = 0x2e;
            pOVar15 = OutStream::operator<<(this->out_stream,(char *)&local_c0);
            OutStream::operator<<(pOVar15,&member_name);
            Class::~Class((Class *)&first);
            std::__cxx11::string::~string((string *)&member_name);
            break;
          }
          std::__cxx11::string::~string((string *)&member_name);
        }
        Class::~Class((Class *)&s);
        break;
      case 0xc1:
      case 0xc2:
        cVar5 = r_code::Atom::readsAsNil();
        if (cVar5 != '\0') {
          pcVar23 = "|[]";
          goto LAB_0013c1b2;
        }
        write_set(this,uVar10,apply_time_offset,write_as_view_index);
        break;
      case 0xc3:
      case 0xc4:
      case 0xc5:
      case 200:
      case 0xc9:
      case 0xca:
      case 0xcb:
      case 0xcc:
      case 0xcd:
      case 0xce:
        uVar10 = r_code::Atom::asOpcode();
        poVar14 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                            (&this->renderers,(ulong)uVar10);
        pcVar20 = (code *)*poVar14;
        plVar22 = (long *)((long)&this->out_stream + poVar14[1]);
        if (((ulong)pcVar20 & 1) != 0) {
          pcVar20 = *(code **)(pcVar20 + *plVar22 + -1);
        }
        (*pcVar20)(plVar22,i);
        break;
      case 0xc6:
        cVar5 = r_code::Atom::readsAsNil();
        if (cVar5 != '\0') {
          pcVar23 = "|st";
          goto LAB_0013c1b2;
        }
        pAVar12 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(uVar24 + 1))
        ;
        _first = *(undefined4 *)pAVar12;
        r_code::vector<r_code::Atom>::operator[]
                  ((vector<r_code::Atom> *)(this->current_object + 8),i);
        r_code::Utils::GetString_abi_cxx11_((Atom *)&s);
        member_name._M_dataplus._M_p._0_1_ = 0x22;
        pOVar15 = OutStream::operator<<(this->out_stream,(char *)&member_name);
        pOVar15 = OutStream::operator<<(pOVar15,&s);
        local_c0._M_dataplus._M_p._0_1_ = 0x22;
        OutStream::operator<<(pOVar15,(char *)&local_c0);
        std::__cxx11::string::~string((string *)&s);
        r_code::Atom::~Atom(&first);
        break;
      case 199:
        cVar5 = r_code::Atom::readsAsNil();
        if (cVar5 == '\0') {
          pAVar12 = r_code::vector<r_code::Atom>::operator[]
                              ((vector<r_code::Atom> *)(this->current_object + 8),i);
          lVar16 = r_code::Utils::GetTimestamp(pAVar12);
          uVar21 = 0;
          if (apply_time_offset) {
            uVar21 = this->time_offset;
          }
          if (this->in_hlp != false) {
            uVar21 = 0;
          }
          if (lVar16 == 0) {
            uVar21 = 0;
          }
          pOVar15 = this->out_stream;
          DebugStream::timestamp_abi_cxx11_(&s,(DebugStream *)(lVar16 - uVar21),0);
          OutStream::push<std::__cxx11::string>(pOVar15,&s,read_index);
          goto LAB_0013c2de;
        }
        pcVar23 = "|us";
        goto LAB_0013c1b2;
      default:
        OutStream::push<char[39]>
                  (this->out_stream,(char (*) [39])"undefined-structural-atom-or-reference",
                   read_index);
      }
    }
    break;
  case 0x90:
    pcVar23 = "this";
LAB_0013c39b:
    OutStream::push<char[5]>(this->out_stream,(char (*) [5])pcVar23,read_index);
    break;
  case 0x91:
    OutStream::push<char[3]>(this->out_stream,(char (*) [3])"vw",read_index);
    break;
  case 0x92:
    pcVar23 = "mks";
    goto LAB_0013c1b2;
  case 0x93:
    pcVar23 = "vws";
LAB_0013c1b2:
    OutStream::push<char[4]>(this->out_stream,(char (*) [4])pcVar23,read_index);
    break;
  case 0xa0:
    cVar5 = r_code::Atom::readsAsNil();
    if (cVar5 != '\0') {
      pcVar23 = "|sid";
      goto LAB_0013c39b;
    }
    goto switchD_0013c025_caseD_87;
  case 0xa1:
    cVar5 = r_code::Atom::readsAsNil();
    if (cVar5 != '\0') {
      pcVar23 = "|did";
      goto LAB_0013c39b;
    }
switchD_0013c025_caseD_87:
    OutStream::push<char[3]>(this->out_stream,(char (*) [3])"0x",read_index);
    pOVar15 = this->out_stream;
    poVar2 = pOVar15->stream;
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    OutStream::operator<<(pOVar15,(uint *)&a);
    break;
  case 0xa2:
    cVar5 = r_code::Atom::readsAsNil();
    if (cVar5 != '\0') {
      pcVar23 = "|fid";
      goto LAB_0013c39b;
    }
    pOVar15 = this->out_stream;
    pMVar4 = this->metadata;
    uVar10 = r_code::Atom::asOpcode();
    t = r_code::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator[](&pMVar4->function_names,(ulong)uVar10);
    OutStream::push<std::__cxx11::string>(pOVar15,t,read_index);
  }
  r_code::Atom::~Atom(&atom);
LAB_0013c3af:
  r_code::Atom::~Atom(&a);
  return;
}

Assistant:

void Decompiler::write_any(uint16_t read_index, bool &after_tail_wildcard, bool apply_time_offset, uint16_t write_as_view_index)   // after_tail_wildcard meant to avoid printing ':' after "::".
{
    Atom a = current_object->code[read_index];

    if (a.isFloat()) {
        if (a.atom == 0x3FFFFFFF) {
            out_stream->push("|nb", read_index);
        } else if (a == Atom::PlusInfinity()) {
            out_stream->push("forever", read_index);
        } else {
            *out_stream << std::dec;
            out_stream->push(a.asFloat(), read_index);
        }

        return;
    }

    Atom atom;
    uint16_t index;

    switch (a.getDescriptor()) {
    case Atom::VL_PTR:
        if (in_hlp) {
            if (a.asCastOpcode() == 0x0FFE) {
                out_stream->push(':', read_index);
            } else {
                std::string s = get_hlp_variable_name(a.asIndex());
                out_stream->push(s, read_index);
            }

            break;
        }

    case Atom::ASSIGN_PTR:
        if (in_hlp) {
            out_stream->push(get_hlp_variable_name(a.asAssignmentIndex()), read_index);
            *out_stream << ":";
        }

    case Atom::I_PTR:
        index = a.asIndex();
        atom = current_object->code[index];

        while (atom.getDescriptor() == Atom::I_PTR) {
            index = atom.asIndex();
            atom = current_object->code[index];
        }

        if (index < read_index) { // reference to a label or variable.
            std::string s = get_variable_name(index, atom.getDescriptor() != Atom::WILDCARD); // post-fix labels with ':' (no need for variables since they are inserted just before wildcards).
            out_stream->push(s, read_index);
            break;
        }

        switch (atom.getDescriptor()) { // structures.
        case Atom::OBJECT:
        case Atom::MARKER:
        case Atom::GROUP:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
        case Atom::INSTANTIATED_ANTI_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
        case Atom::OPERATOR:
            (this->*renderers[atom.asOpcode()])(index);
            break;

        case Atom::SET:
        case Atom::S_SET:
            if (atom.readsAsNil()) {
                out_stream->push("|[]", read_index);
            } else {
                write_set(index, apply_time_offset, write_as_view_index);
            }

            break;

        case Atom::STRING:
            if (atom.readsAsNil()) {
                out_stream->push("|st", read_index);
            } else {
                Atom first = current_object->code[index + 1];
                std::string s = Utils::GetString(&current_object->code[index]);
                *out_stream << '\"' << s << '\"';
            }

            break;

        case Atom::TIMESTAMP:
            if (atom.readsAsNil()) {
                out_stream->push("|us", read_index);
            } else {
                uint64_t ts = Utils::GetTimestamp(&current_object->code[index]);

                if (!in_hlp && ts > 0 && apply_time_offset) {
                    ts -= time_offset;
                }

                out_stream->push(DebugStream::timestamp(ts), read_index);
            }

            break;

        case Atom::C_PTR: {
            uint16_t opcode;
            uint16_t member_count = atom.getAtomCount();
            atom = current_object->code[index + 1]; // current_object->code[index] is the cptr; lead atom is at index+1; iptrs start at index+2.

            switch (atom.getDescriptor()) {
            case Atom::THIS: // this always refers to an instantiated reactive object.
                out_stream->push("this", read_index);
                opcode = metadata->sys_classes["ipgm"].atom.asOpcode();
                break;

            case Atom::VL_PTR: {
                uint8_t cast_opcode = atom.asCastOpcode();

                while (current_object->code[atom.asIndex()].getDescriptor() == Atom::I_PTR) { // position to a structure or an atomic value.
                    atom = current_object->code[atom.asIndex()];
                }

                out_stream->push(get_variable_name(atom.asIndex(), current_object->code[atom.asIndex()].getDescriptor() != Atom::WILDCARD), read_index);

                if (cast_opcode == 0xFF) {
                    if (current_object->code[atom.asIndex()].getDescriptor() == Atom::WILDCARD) {
                        opcode = current_object->code[atom.asIndex()].asOpcode();
                    } else {
                        opcode = current_object->code[atom.asIndex()].asOpcode();
                    }
                } else {
                    opcode = cast_opcode;
                }

                break;
            }

            case Atom::R_PTR: {
                uint64_t object_index = current_object->references[atom.asIndex()];
                out_stream->push(get_object_name(object_index), read_index);
                opcode = image->code_segment.objects[object_index]->code[0].asOpcode();
                break;
            }

            default:
                out_stream->push("unknown-cptr-lead-type", read_index);
                return;
            }

            Class embedding_class = metadata->classes_by_opcodes[opcode]; // class defining the members.

            for (uint16_t i = 2; i <= member_count; ++i) { // get the class of the pointed structure and retrieve the member name from i.
                std::string member_name;
                atom = current_object->code[index + i]; // atom is an iptr appearing after the leading atom in the cptr.

                switch (atom.getDescriptor()) {
                case Atom::VIEW:
                    member_name = "vw";
                    break;

                case Atom::MKS:
                    member_name = "mks";
                    break;

                case Atom::VWS:
                    member_name = "vws";
                    break;

                default:
                    member_name = embedding_class.get_member_name(atom.asIndex());

                    if (i < member_count) { // not the last member, get the next class.
                        embedding_class = *embedding_class.get_member_class(metadata, member_name);
                    }

                    break;
                }

                *out_stream << '.' << member_name;

                if (member_name == "vw") { // special case: no view structure in the code, vw is just a place holder; vw is the second to last member of the cptr: write the last member and exit.
                    atom = current_object->code[index + member_count]; // atom is the last internal pointer.
                    Class view_class;

                    if (embedding_class.str_opcode == "grp") {
                        view_class = metadata->classes.find("grp_view")->second;
                    } else if (embedding_class.str_opcode == "ipgm" ||
                               embedding_class.str_opcode == "icpp_pgm" ||
                               embedding_class.str_opcode == "mdl" ||
                               embedding_class.str_opcode == "cst") {
                        view_class = metadata->classes.find("pgm_view")->second;
                    } else {
                        view_class = metadata->classes.find("view")->second;
                    }

                    member_name = view_class.get_member_name(atom.asIndex());
                    *out_stream << '.' << member_name;
                    break;
                }
            }

            break;
        }

        default:
            out_stream->push("undefined-structural-atom-or-reference", read_index);
            break;
        }

        break;

    case Atom::R_PTR:
        out_stream->push(get_object_name(current_object->references[a.asIndex()]), read_index);
        break;

    case Atom::THIS:
        out_stream->push("this", read_index);
        break;

    case Atom::NIL:
        out_stream->push("nil", read_index);
        break;

    case Atom::BOOLEAN_:
        if (a.readsAsNil()) {
            out_stream->push("|bl", read_index);
        } else {
            *out_stream << std::boolalpha;
            out_stream->push(a.asBoolean(), read_index);
        }

        break;

    case Atom::WILDCARD:
        if (after_tail_wildcard) {
            out_stream->push();
        } else {
            out_stream->push(':', read_index);
        }

        break;

    case Atom::T_WILDCARD:
        out_stream->push("::", read_index);
        after_tail_wildcard = true;
        break;

    case Atom::NODE:
        if (a.readsAsNil()) {
            out_stream->push("|sid", read_index);
        } else {
            out_stream->push("0x", read_index);
            *out_stream << std::hex;
            *out_stream << a.atom;
        }

        break;

    case Atom::DEVICE:
        if (a.readsAsNil()) {
            out_stream->push("|did", read_index);
        } else {
            out_stream->push("0x", read_index);
            *out_stream << std::hex;
            *out_stream << a.atom;
        }

        break;

    case Atom::DEVICE_FUNCTION:
        if (a.readsAsNil()) {
            out_stream->push("|fid", read_index);
        } else {
            out_stream->push(metadata->function_names[a.asOpcode()], read_index);
        }

        break;

    case Atom::VIEW:
        out_stream->push("vw", read_index);
        break;

    case Atom::MKS:
        out_stream->push("mks", read_index);
        break;

    case Atom::VWS:
        out_stream->push("vws", read_index);
        break;

    default:
        // out_stream->push("undefined-atom",read_index).
        out_stream->push("0x", read_index);
        *out_stream << std::hex;
        *out_stream << a.atom;
        break;
    }
}